

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doRemoveCols(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int *perm)

{
  int iVar1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int *piVar2;
  int extraout_EDX;
  int __c;
  int __c_00;
  int extraout_EDX_00;
  int extraout_EDX_01;
  char *in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int idx;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  int i;
  int nrows;
  int in_stack_ffffffffffffffcc;
  uint local_24;
  int local_18;
  
  iVar1 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x304ead);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::remove(&in_RDI->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,in_RSI);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    this_00 = rowVector_w(in_RDI,in_stack_ffffffffffffffcc);
    local_24 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::size(this_00);
    __c = extraout_EDX;
    while (local_24 = local_24 - 1, -1 < (int)local_24) {
      piVar2 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::index(this_00,(char *)(ulong)local_24,__c);
      if (*(int *)(in_RSI + (long)*piVar2 * 4) < 0) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove(this_00,(char *)(ulong)local_24);
        __c = extraout_EDX_00;
      }
      else {
        in_stack_ffffffffffffffcc = *(int *)(in_RSI + (long)*piVar2 * 4);
        piVar2 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::index(this_00,(char *)(ulong)local_24,__c_00);
        *piVar2 = in_stack_ffffffffffffffcc;
        __c = extraout_EDX_01;
      }
    }
  }
  return;
}

Assistant:

virtual void doRemoveCols(int perm[])
   {
      int nrows = nRows();

      LPColSetBase<R>::remove(perm);

      for(int i = 0; i < nrows; ++i)
      {
         SVectorBase<R>& vec = rowVector_w(i);

         for(int k = vec.size() - 1; k >= 0; --k)
         {
            int idx = vec.index(k);

            if(perm[idx] < 0)
               vec.remove(k);
            else
               vec.index(k) = perm[idx];
         }
      }
   }